

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_store.hxx
# Opt level: O0

void __thiscall
nuraft::log_store::compact_async(log_store *this,ulong last_log_index,handler_type *when_done)

{
  undefined8 in_RSI;
  long *in_RDI;
  ptr<std::exception> exp;
  bool rc;
  shared_ptr<std::exception> *in_stack_ffffffffffffffc0;
  bool *in_stack_ffffffffffffffc8;
  function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *in_stack_ffffffffffffffd0;
  
  (**(code **)(*in_RDI + 0x70))(in_RDI,in_RSI);
  std::shared_ptr<std::exception>::shared_ptr(in_stack_ffffffffffffffc0,&stack0xffffffffffffffd0);
  std::function<void_(bool_&,_std::shared_ptr<std::exception>_&)>::operator()
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x22d29b);
  return;
}

Assistant:

virtual void compact_async(ulong last_log_index,
                               const async_result<bool>::handler_type& when_done) {
        bool rc = compact(last_log_index);
        ptr<std::exception> exp(nullptr);
        when_done(rc, exp);
    }